

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

bool __thiscall cmsys::Directory::Load(Directory *this,string *name)

{
  DirectoryInternals *this_00;
  DIR *__dirp;
  dirent64 *pdVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Clear(this);
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar1 = readdir64(__dirp);
    while (this_00 = this->Internal, pdVar1 != (dirent64 *)0x0) {
      std::__cxx11::string::string((string *)&local_50,pdVar1->d_name,&local_51);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pdVar1 = readdir64(__dirp);
    }
    std::__cxx11::string::_M_assign((string *)&this_00->Path);
    closedir(__dirp);
  }
  return __dirp != (DIR *)0x0;
}

Assistant:

bool Directory::Load(const std::string& name)
{
  this->Clear();
   
  DIR* dir = opendir(name.c_str());

  if (!dir)
    {
    return 0;
    }

  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir) )
    {
    this->Internal->Files.push_back(d->d_name);
    }
  this->Internal->Path = name;
  closedir(dir);
  return 1;
}